

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

void __thiscall
duckdb::DataTable::InitializeAppend
          (DataTable *this,DuckTransaction *transaction,TableAppendState *state)

{
  TransactionData transaction_00;
  RowGroupCollection *this_00;
  InternalException *this_01;
  string local_60;
  TransactionData local_40;
  
  if ((state->append_lock)._M_owns != false) {
    this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
    TransactionData::TransactionData(&local_40,transaction);
    transaction_00.transaction_id = local_40.transaction_id;
    transaction_00.transaction.ptr = local_40.transaction.ptr;
    transaction_00.start_time = local_40.start_time;
    RowGroupCollection::InitializeAppend(this_00,transaction_00,state);
    return;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "DataTable::AppendLock should be called before DataTable::InitializeAppend","");
  InternalException::InternalException(this_01,&local_60);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DataTable::InitializeAppend(DuckTransaction &transaction, TableAppendState &state) {
	// obtain the append lock for this table
	if (!state.append_lock) {
		throw InternalException("DataTable::AppendLock should be called before DataTable::InitializeAppend");
	}
	row_groups->InitializeAppend(transaction, state);
}